

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_77::BinaryReaderIR::OnSimdLaneOpExpr
          (BinaryReaderIR *this,Opcode opcode,uint64_t value)

{
  Result RVar1;
  Expr *local_30;
  Opcode local_24;
  _Head_base<0UL,_wabt::Expr_*,_false> local_20;
  uint64_t local_18;
  
  local_24.enum_ = opcode.enum_;
  local_18 = value;
  MakeUnique<wabt::SimdLaneOpExpr,wabt::Opcode&,unsigned_long&>
            ((wabt *)&local_30,&local_24,&local_18);
  local_20._M_head_impl = local_30;
  local_30 = (Expr *)0x0;
  RVar1 = AppendExpr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_20);
  if (local_20._M_head_impl != (Expr *)0x0) {
    (*(local_20._M_head_impl)->_vptr_Expr[1])();
  }
  if (local_30 != (Expr *)0x0) {
    (**(code **)(*(long *)local_30 + 8))();
  }
  return (Result)RVar1.enum_;
}

Assistant:

Result BinaryReaderIR::OnSimdLaneOpExpr(Opcode opcode, uint64_t value) {
  return AppendExpr(MakeUnique<SimdLaneOpExpr>(opcode, value));
}